

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  ImGuiWindow *pIVar5;
  char *__s;
  ImGuiContext *pIVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  
  while( true ) {
    pIVar6 = GImGui;
    pIVar5 = GImGui->CurrentWindow;
    pcVar9 = GImGui->LogNextPrefix;
    __s = GImGui->LogNextSuffix;
    GImGui->LogNextPrefix = (char *)0x0;
    pIVar6->LogNextSuffix = (char *)0x0;
    if (text_end == (char *)0x0) {
      text_end = FindRenderedTextEnd(text,(char *)0x0);
    }
    if (ref_pos != (ImVec2 *)0x0) {
      fVar1 = ref_pos->y;
      fVar2 = pIVar6->LogLinePosY;
      fVar3 = (pIVar6->Style).FramePadding.y;
      pIVar6->LogLinePosY = fVar1;
      if (fVar2 + fVar3 + 1.0 < fVar1) {
        LogText("\n");
        pIVar6->LogLineFirstItem = true;
      }
    }
    if (pcVar9 != (char *)0x0) {
      sVar8 = strlen(pcVar9);
      LogRenderedText(ref_pos,pcVar9,pcVar9 + sVar8);
    }
    iVar4 = (pIVar5->DC).TreeDepth;
    iVar7 = pIVar6->LogDepthRef;
    iVar11 = iVar4;
    if (iVar4 < pIVar6->LogDepthRef) {
      pIVar6->LogDepthRef = iVar4;
      iVar11 = (pIVar5->DC).TreeDepth;
      iVar7 = iVar4;
    }
    do {
      pcVar9 = ImStreolRange(text,text_end);
      if ((text != pcVar9) || (pcVar9 != text_end)) {
        uVar10 = 1;
        if (pIVar6->LogLineFirstItem != false) {
          uVar10 = (ulong)(uint)((iVar11 - iVar7) * 4);
        }
        LogText("%*s%.*s",uVar10,"",(ulong)(uint)((int)pcVar9 - (int)text),text);
        pIVar6->LogLineFirstItem = false;
        if (*pcVar9 == '\n') {
          LogText("\n");
          pIVar6->LogLineFirstItem = true;
        }
      }
      text = pcVar9 + 1;
    } while (pcVar9 != text_end);
    if (__s == (char *)0x0) break;
    sVar8 = strlen(__s);
    text_end = __s + sVar8;
    text = __s;
  }
  return;
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const char* prefix = g.LogNextPrefix;
    const char* suffix = g.LogNextSuffix;
    g.LogNextPrefix = g.LogNextSuffix = NULL;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > g.LogLinePosY + g.Style.FramePadding.y + 1);
    if (ref_pos)
        g.LogLinePosY = ref_pos->y;
    if (log_new_line)
    {
        LogText(IM_NEWLINE);
        g.LogLineFirstItem = true;
    }

    if (prefix)
        LogRenderedText(ref_pos, prefix, prefix + strlen(prefix)); // Calculate end ourself to ensure "##" are included here.

    // Re-adjust padding if we have popped out of our starting depth
    if (g.LogDepthRef > window->DC.TreeDepth)
        g.LogDepthRef = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogDepthRef);

    const char* text_remaining = text;
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by indentation corresponding to the current depth of our log entry.
        // We don't add a trailing \n yet to allow a subsequent item on the same line to be captured.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_last_line = (line_end == text_end);
        if (line_start != line_end || !is_last_line)
        {
            const int line_length = (int)(line_end - line_start);
            const int indentation = g.LogLineFirstItem ? tree_depth * 4 : 1;
            LogText("%*s%.*s", indentation, "", line_length, line_start);
            g.LogLineFirstItem = false;
            if (*line_end == '\n')
            {
                LogText(IM_NEWLINE);
                g.LogLineFirstItem = true;
            }
        }
        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }

    if (suffix)
        LogRenderedText(ref_pos, suffix, suffix + strlen(suffix));
}